

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_tests.cpp
# Opt level: O0

TestBuilder * __thiscall
anon_unknown.dwarf_af3cfc::TestBuilder::Push(TestBuilder *this,CPubKey *pubkey)

{
  long lVar1;
  uchar *in_RSI;
  TestBuilder *in_RDI;
  long in_FS_OFFSET;
  allocator<unsigned_char> *in_stack_ffffffffffffff88;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff90;
  allocator_type *in_stack_ffffffffffffffc0;
  TestBuilder *this_00;
  uchar *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  CPubKey::begin((CPubKey *)in_stack_ffffffffffffff88);
  CPubKey::end((CPubKey *)in_RDI);
  std::allocator<unsigned_char>::allocator(in_stack_ffffffffffffff88);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00,
             in_stack_ffffffffffffffd8,in_RSI,in_stack_ffffffffffffffc0);
  DoPush(in_RDI,in_stack_ffffffffffffff90);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_RDI);
  std::allocator<unsigned_char>::~allocator(in_stack_ffffffffffffff88);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

TestBuilder& Push(const CPubKey& pubkey)
    {
        DoPush(std::vector<unsigned char>(pubkey.begin(), pubkey.end()));
        return *this;
    }